

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int encode_ulong_constructor
              (AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,_Bool use_smallest)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  uchar local_a [2];
  
  if ((int)CONCAT71(in_register_00000011,use_smallest) == 0) {
    local_a[1] = 0x80;
    iVar1 = (*encoder_output)(context,local_a + 1,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xa98;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xa98;
    }
    pcVar4 = "Failed encoding ulong constructor";
    iVar3 = 0xa97;
  }
  else {
    local_a[0] = 'S';
    iVar1 = (*encoder_output)(context,local_a,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0xa89;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0xa89;
    }
    pcVar4 = "Failed encoding small ulong constructor";
    iVar3 = 0xa88;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"encode_ulong_constructor",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int encode_ulong_constructor(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, bool use_smallest)
{
    int result;

    if (use_smallest)
    {
        /* smallulong */
        /* Codes_SRS_AMQPVALUE_01_281: [<encoding name="smallulong" code="0x53" category="fixed" width="1" label="unsigned long value in the range 0 to 255 inclusive"/>] */
        if (output_byte(encoder_output, context, 0x53) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding small ulong constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_280: [<encoding code="0x80" category="fixed" width="8" label="64-bit unsigned integer in network byte order"/>] */
        if (output_byte(encoder_output, context, 0x80) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding ulong constructor");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
            result = 0;
        }
    }

    return result;
}